

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_info.c
# Opt level: O2

int readline(char *allbuf,int level,char *linebuf)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  
  sVar2 = strlen(allbuf);
  iVar4 = level + 2;
  for (lVar3 = (long)level;
      (iVar1 = -1, lVar3 < (int)sVar2 &&
      ((allbuf[lVar3] != '\r' || (iVar1 = iVar4, allbuf[lVar3 + 1] != '\n')))); lVar3 = lVar3 + 1) {
    *linebuf = allbuf[lVar3];
    linebuf = linebuf + 1;
    iVar4 = iVar4 + 1;
  }
  return iVar1;
}

Assistant:

int readline(char* allbuf,int level,char* linebuf){
    int len = strlen(allbuf);
    for (;level<len;++level)
    {
        if(allbuf[level]=='\r' && allbuf[level+1]=='\n')
            return level+2;
        else
            *(linebuf++) = allbuf[level];
    }
    return -1;
}